

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunc.cpp
# Opt level: O1

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)

{
  ULONG UVar1;
  OLECHAR OVar2;
  OLECHAR OVar3;
  OLECHAR *pOVar4;
  
  OVar2 = *posz;
  if (OVar2 != L'\0') {
    pOVar4 = posz + 1;
    UVar1 = 0;
    do {
      OVar3 = OVar2 | 0x20;
      if (0x19 < (ushort)(OVar2 + L'﾿')) {
        OVar3 = OVar2;
      }
      UVar1 = (uint)(ushort)OVar3 + UVar1 * 0x11;
      OVar2 = *pOVar4;
      pOVar4 = pOVar4 + 1;
    } while (OVar2 != L'\0');
    return UVar1;
  }
  return 0;
}

Assistant:

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)
{
    ULONG luHash = 0;
    char16 ch;
    while (0 != (ch = *(char16 *)posz++))
    {
        if (ch <= 'Z' && ch >= 'A')
            ch += 'a' - 'A';
        luHash = 17 * luHash + ch;
    }
    return luHash;
}